

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O0

void aom_highbd_convolve_copy_sse2
               (uint16_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  __m128i s_4 [8];
  __m128i s_3 [4];
  __m128i s_2 [2];
  __m128i s_1 [2];
  __m128i s;
  uint16_t *in_stack_fffffffffffffb88;
  uint16_t *in_stack_fffffffffffffc00;
  uint16_t *in_stack_fffffffffffffc08;
  int local_360;
  undefined8 *local_350;
  undefined8 *local_340;
  undefined4 local_48;
  undefined4 local_28;
  
  local_360 = in_R9D;
  local_350 = in_RDX;
  local_340 = in_RDI;
  if (in_R8D == 2) {
    do {
      local_28 = (undefined4)*local_340;
      *(undefined4 *)local_350 = local_28;
      local_340 = (undefined8 *)((long)local_340 + in_RSI * 2);
      puVar1 = (undefined4 *)((long)local_350 + in_RCX * 2);
      local_48 = (undefined4)*local_340;
      *puVar1 = local_48;
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      local_350 = (undefined8 *)(in_RCX * 2 + (long)puVar1);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else if (in_R8D == 4) {
    do {
      uVar2 = *local_340;
      local_340 = (undefined8 *)((long)local_340 + in_RSI * 2);
      uVar3 = *local_340;
      local_340 = (undefined8 *)((long)local_340 + in_RSI * 2);
      *local_350 = uVar2;
      local_350 = (undefined8 *)((long)local_350 + in_RCX * 2);
      *local_350 = uVar3;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else if (in_R8D == 8) {
    do {
      uVar2 = *local_340;
      uVar3 = local_340[1];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      uVar4 = *local_340;
      uVar5 = local_340[1];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      *local_350 = uVar2;
      local_350[1] = uVar3;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      *local_350 = uVar4;
      local_350[1] = uVar5;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else if (in_R8D == 0x10) {
    do {
      uVar2 = *local_340;
      uVar3 = local_340[1];
      uVar4 = local_340[2];
      uVar5 = local_340[3];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      uVar6 = *local_340;
      uVar7 = local_340[1];
      uVar8 = local_340[2];
      uVar9 = local_340[3];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      *local_350 = uVar2;
      local_350[1] = uVar3;
      local_350[2] = uVar4;
      local_350[3] = uVar5;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      *local_350 = uVar6;
      local_350[1] = uVar7;
      local_350[2] = uVar8;
      local_350[3] = uVar9;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else if (in_R8D == 0x20) {
    do {
      uVar2 = *local_340;
      uVar3 = local_340[1];
      uVar4 = local_340[2];
      uVar5 = local_340[3];
      uVar6 = local_340[4];
      uVar7 = local_340[5];
      uVar8 = local_340[6];
      uVar9 = local_340[7];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      uVar10 = *local_340;
      uVar11 = local_340[1];
      uVar12 = local_340[2];
      uVar13 = local_340[3];
      uVar14 = local_340[4];
      uVar15 = local_340[5];
      uVar16 = local_340[6];
      uVar17 = local_340[7];
      local_340 = (undefined8 *)(in_RSI * 2 + (long)local_340);
      *local_350 = uVar2;
      local_350[1] = uVar3;
      local_350[2] = uVar4;
      local_350[3] = uVar5;
      local_350[4] = uVar6;
      local_350[5] = uVar7;
      local_350[6] = uVar8;
      local_350[7] = uVar9;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      *local_350 = uVar10;
      local_350[1] = uVar11;
      local_350[2] = uVar12;
      local_350[3] = uVar13;
      local_350[4] = uVar14;
      local_350[5] = uVar15;
      local_350[6] = uVar16;
      local_350[7] = uVar17;
      local_350 = (undefined8 *)(in_RCX * 2 + (long)local_350);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else if (in_R8D == 0x40) {
    do {
      highbd_copy_64(in_stack_fffffffffffffb88,(uint16_t *)0x3c298b);
      highbd_copy_64(in_stack_fffffffffffffb88,(uint16_t *)0x3c29d6);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  else {
    do {
      highbd_copy_128(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      highbd_copy_128(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      local_360 = local_360 + -2;
    } while (local_360 != 0);
  }
  return;
}

Assistant:

void aom_highbd_convolve_copy_sse2(const uint16_t *src, ptrdiff_t src_stride,
                                   uint16_t *dst, ptrdiff_t dst_stride, int w,
                                   int h) {
  // The w >= 8 cases use _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w >= 8) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 8));
  }

  if (w == 2) {
    do {
      __m128i s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m128i s[4];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      s[2] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m128i s[8];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      s[4] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[5] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[6] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[7] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[3]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[4]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[5]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[6]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[7]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    do {
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}